

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void read_tx_size_vartx(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,TX_SIZE tx_size,int depth,int blk_row,
                       int blk_col,aom_reader *r)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FRAME_CONTEXT *pFVar9;
  short sVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  aom_cdf_prob (*icdf) [3];
  TX_SIZE TVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  int idx_2;
  int idx;
  int iVar23;
  ulong uVar24;
  TXFM_CONTEXT *__s;
  int col;
  
  BVar1 = mbmi->bsize;
  bVar16 = block_size_high[BVar1];
  uVar19 = (uint)bVar16;
  if (xd->mb_to_bottom_edge < 0) {
    uVar19 = (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f)) + uVar19;
  }
  bVar2 = block_size_wide[BVar1];
  uVar20 = (uint)bVar2;
  if (xd->mb_to_right_edge < 0) {
    uVar20 = (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f)) + (uint)bVar2;
  }
  if ((int)uVar19 >> 2 <= blk_row) {
    return;
  }
  if ((int)uVar20 >> 2 <= blk_col) {
    return;
  }
  bVar3 = ""[""[BVar1]];
  bVar11 = (char)tx_size_wide_log2[bVar3] - 2;
  bVar14 = (char)tx_size_high_log2[bVar3] - 2;
  bVar15 = ""[BVar1] - bVar11;
  if (depth == 2) {
    iVar13 = tx_size_high_unit[tx_size];
    iVar6 = tx_size_wide_unit[tx_size];
    iVar7 = *(int *)((long)tx_size_high_unit + (ulong)((uint)bVar3 * 4));
    iVar8 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)bVar3 * 4));
    iVar21 = 0;
    do {
      iVar23 = 0;
      do {
        mbmi->inter_tx_size
        [(blk_col + iVar23 >> (bVar11 & 0x1f)) +
         ((iVar21 + blk_row >> (bVar14 & 0x1f)) << (bVar15 & 0x1f))] = tx_size;
        iVar23 = iVar23 + iVar8;
      } while (iVar23 < iVar6);
      iVar21 = iVar21 + iVar7;
    } while (iVar21 < iVar13);
    mbmi->tx_size = tx_size;
    __s = xd->above_txfm_context + blk_col;
    bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[tx_size]];
    uVar19 = *(uint *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
    memset(xd->left_txfm_context + blk_row,*(int *)((long)tx_size_high + (ulong)((uint)tx_size * 4))
           ,(ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[tx_size]] +
                    (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [txsize_to_bsize[tx_size]] == 0) & 0xff));
    uVar20 = (uint)bVar16 + (uint)(bVar16 == 0);
    goto LAB_00175638;
  }
  uVar24 = (ulong)tx_size;
  uVar19 = (uint)*(byte *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
  uVar20 = (uint)*(byte *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
  pFVar9 = xd->tile_ctx;
  if (tx_size == '\0') {
    lVar17 = 0;
  }
  else {
    uVar12 = (uint)bVar16;
    if (bVar16 < bVar2) {
      uVar12 = (uint)bVar2;
    }
    bVar16 = 1;
    uVar22 = 0x3f;
    if (uVar12 < 0x20) {
      if (uVar12 == 8) {
        TVar18 = '\x01';
        bVar16 = 0;
      }
      else {
        if (uVar12 != 0x10) goto LAB_00175318;
        TVar18 = '\x02';
      }
LAB_001752f0:
      uVar22 = (ulong)(byte)(((""[uVar24] != TVar18 & bVar16) + TVar18 * -2) * '\x03' + 0x18);
    }
    else {
      TVar18 = '\x04';
      if ((uVar12 == 0x80) || (uVar12 == 0x40)) goto LAB_001752f0;
      if (uVar12 == 0x20) {
        TVar18 = '\x03';
        goto LAB_001752f0;
      }
    }
LAB_00175318:
    lVar17 = (ulong)(xd->left_txfm_context[blk_row] < uVar20) +
             (ulong)(xd->above_txfm_context[blk_col] < uVar19) + uVar22;
  }
  icdf = pFVar9->txfm_partition_cdf + lVar17;
  iVar13 = od_ec_decode_cdf_q15(&r->ec,*icdf,2);
  if (r->allow_update_cdf != '\0') {
    uVar4 = pFVar9->txfm_partition_cdf[lVar17][2];
    bVar16 = (char)(uVar4 >> 4) + 4;
    uVar5 = (*icdf)[0];
    if ((char)iVar13 < '\x01') {
      sVar10 = -(uVar5 >> (bVar16 & 0x1f));
    }
    else {
      sVar10 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
    }
    (*icdf)[0] = sVar10 + uVar5;
    pFVar9->txfm_partition_cdf[lVar17][2] = uVar4 + (uVar4 < 0x20);
  }
  if (iVar13 == 0) {
    iVar13 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    iVar6 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    iVar7 = *(int *)((long)tx_size_high_unit + (ulong)((uint)bVar3 * 4));
    iVar8 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)bVar3 * 4));
    iVar21 = 0;
    do {
      iVar23 = 0;
      do {
        mbmi->inter_tx_size
        [(blk_col + iVar23 >> (bVar11 & 0x1f)) +
         ((iVar21 + blk_row >> (bVar14 & 0x1f)) << (bVar15 & 0x1f))] = tx_size;
        iVar23 = iVar23 + iVar8;
      } while (iVar23 < iVar6);
      iVar21 = iVar21 + iVar7;
    } while (iVar21 < iVar13);
    mbmi->tx_size = tx_size;
    __s = xd->above_txfm_context + blk_col;
    bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar24]];
    memset(xd->left_txfm_context + blk_row,uVar20,
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar24]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar24]] == 0) & 0xff));
    uVar20 = (uint)bVar16 + (uint)(bVar16 == 0);
  }
  else {
    bVar16 = ""[uVar24];
    iVar13 = *(int *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    iVar6 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    if ((99UL >> (uVar24 & 0x3f) & 1) == 0) {
      iVar7 = tx_size_wide_unit[bVar16];
      iVar8 = tx_size_high_unit[bVar16];
      iVar21 = 0;
      do {
        iVar23 = 0;
        do {
          read_tx_size_vartx(xd,mbmi,bVar16,depth + 1,iVar21 + blk_row,blk_col + iVar23,r);
          iVar23 = iVar23 + iVar7;
        } while (iVar23 < iVar6);
        iVar21 = iVar21 + iVar8;
      } while (iVar21 < iVar13);
      return;
    }
    iVar7 = *(int *)((long)tx_size_high_unit + (ulong)((uint)bVar3 * 4));
    iVar8 = *(int *)((long)tx_size_wide_unit + (ulong)((uint)bVar3 * 4));
    iVar21 = 0;
    do {
      iVar23 = 0;
      do {
        mbmi->inter_tx_size
        [(blk_col + iVar23 >> (bVar11 & 0x1f)) +
         ((iVar21 + blk_row >> (bVar14 & 0x1f)) << (bVar15 & 0x1f))] = '\0';
        iVar23 = iVar23 + iVar8;
      } while (iVar23 < iVar6);
      iVar21 = iVar21 + iVar7;
    } while (iVar21 < iVar13);
    mbmi->tx_size = bVar16;
    __s = xd->above_txfm_context + blk_col;
    bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [txsize_to_bsize[uVar24]];
    uVar19 = tx_size_wide[bVar16];
    memset(xd->left_txfm_context + blk_row,tx_size_high[bVar16],
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar24]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar24]] == 0) & 0xff));
    uVar20 = (uint)bVar2 + (uint)(bVar2 == 0);
  }
LAB_00175638:
  memset(__s,uVar19,(ulong)(uVar20 & 0xff));
  return;
}

Assistant:

static inline void read_tx_size_vartx(MACROBLOCKD *xd, MB_MODE_INFO *mbmi,
                                      TX_SIZE tx_size, int depth, int blk_row,
                                      int blk_col, aom_reader *r) {
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  int is_split = 0;
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;
  assert(tx_size > TX_4X4);
  TX_SIZE txs = max_txsize_rect_lookup[bsize];
  for (int level = 0; level < MAX_VARTX_DEPTH - 1; ++level)
    txs = sub_tx_size_map[txs];
  const int tx_w_log2 = tx_size_wide_log2[txs] - MI_SIZE_LOG2;
  const int tx_h_log2 = tx_size_high_log2[txs] - MI_SIZE_LOG2;
  const int bw_log2 = mi_size_wide_log2[bsize];
  const int stride_log2 = bw_log2 - tx_w_log2;

  if (depth == MAX_VARTX_DEPTH) {
    set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                      tx_size, blk_row, blk_col);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  const int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                         xd->left_txfm_context + blk_row,
                                         mbmi->bsize, tx_size);
  is_split = aom_read_symbol(r, ec_ctx->txfm_partition_cdf[ctx], 2, ACCT_STR);

  if (is_split) {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

    if (sub_txs == TX_4X4) {
      set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                        sub_txs, blk_row, blk_col);
      mbmi->tx_size = sub_txs;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, sub_txs, tx_size);
      return;
    }

    assert(bsw > 0 && bsh > 0);
    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        int offsetr = blk_row + row;
        int offsetc = blk_col + col;
        read_tx_size_vartx(xd, mbmi, sub_txs, depth + 1, offsetr, offsetc, r);
      }
    }
  } else {
    set_inter_tx_size(mbmi, stride_log2, tx_w_log2, tx_h_log2, txs, tx_size,
                      tx_size, blk_row, blk_col);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
  }
}